

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

int lua_lessthan(lua_State *L,int idx1,int idx2)

{
  TValue *pTVar1;
  TValue *o2;
  TValue *pTVar2;
  TValue *pTVar3;
  
  pTVar1 = index2adr(L,idx1);
  o2 = index2adr(L,idx2);
  pTVar2 = (TValue *)((L->glref).ptr64 + 0xf8);
  pTVar3 = (TValue *)0x0;
  if (o2 != pTVar2 && pTVar1 != pTVar2) {
    if (((pTVar1->field_4).it >> 0xf < 0x1fff3) && ((ulong)o2->n < 0xfff9800000000000)) {
      pTVar3 = (TValue *)(ulong)((double)pTVar1->field_4 < o2->n);
    }
    else {
      pTVar3 = lj_meta_comp(L,pTVar1,o2,0);
      if ((TValue *)0x1 < pTVar3) {
        L->top = pTVar3 + 2;
        lj_vm_call(L,pTVar3,2);
        pTVar1 = L->top;
        L->top = pTVar1 + -3;
        pTVar3 = (TValue *)(ulong)(*(short *)((long)pTVar1 + -2) != -1);
      }
    }
  }
  return (int)pTVar3;
}

Assistant:

LUA_API int lua_lessthan(lua_State *L, int idx1, int idx2)
{
  cTValue *o1 = index2adr(L, idx1);
  cTValue *o2 = index2adr(L, idx2);
  if (o1 == niltv(L) || o2 == niltv(L)) {
    return 0;
  } else if (tvisint(o1) && tvisint(o2)) {
    return intV(o1) < intV(o2);
  } else if (tvisnumber(o1) && tvisnumber(o2)) {
    return numberVnum(o1) < numberVnum(o2);
  } else {
    TValue *base = lj_meta_comp(L, o1, o2, 0);
    if ((uintptr_t)base <= 1) {
      return (int)(uintptr_t)base;
    } else {
      L->top = base+2;
      lj_vm_call(L, base, 1+1);
      L->top -= 2+LJ_FR2;
      return tvistruecond(L->top+1+LJ_FR2);
    }
  }
}